

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opusfile.c
# Opt level: O0

int op_test(OpusHead *_head,uchar *_initial_data,size_t _initial_bytes)

{
  int iVar1;
  undefined4 uVar2;
  int iVar3;
  void *__dest;
  uchar *local_248;
  ogg_packet op;
  undefined1 local_210 [4];
  int ret;
  ogg_page og;
  ogg_stream_state os;
  int err;
  char *data;
  ogg_sync_state oy;
  size_t _initial_bytes_local;
  uchar *_initial_data_local;
  OpusHead *_head_local;
  
  if (_initial_bytes < 0x2f) {
    _head_local._4_4_ = -1;
  }
  else if (*(int *)_initial_data == 0x5367674f) {
    if (_initial_bytes < 0x8000000000000000) {
      oy._24_8_ = _initial_bytes;
      ogg_sync_init(&data);
      __dest = (void *)ogg_sync_buffer(&data,oy._24_8_);
      if (__dest == (void *)0x0) {
        os.granulepos._4_4_ = -0x81;
      }
      else {
        memcpy(__dest,_initial_data,oy._24_8_);
        ogg_sync_wrote(&data,oy._24_8_);
        ogg_stream_init(&og.body_len,0xffffffff);
        os.granulepos._4_4_ = -1;
        do {
          op.packetno._4_4_ = ogg_sync_pageout(&data,local_210);
          if (-1 < op.packetno._4_4_) {
            if (op.packetno._4_4_ == 0) break;
            uVar2 = ogg_page_serialno(local_210);
            ogg_stream_reset_serialno(&og.body_len,uVar2);
            ogg_stream_pagein(&og.body_len,local_210);
            iVar3 = ogg_stream_packetout(&og.body_len,&local_248);
            iVar1 = os.granulepos._4_4_;
            if (iVar3 == 1) {
              if (op.bytes == 0) {
                os.granulepos._4_4_ = -0x84;
                iVar1 = os.granulepos._4_4_;
              }
              else {
                op.packetno._4_4_ = opus_head_parse(_head,local_248,(size_t)op.packet);
                iVar1 = op.packetno._4_4_;
                if (op.packetno._4_4_ == -0x84) goto LAB_00107407;
              }
            }
            os.granulepos._4_4_ = iVar1;
          }
LAB_00107407:
        } while (os.granulepos._4_4_ == -1);
        ogg_stream_clear(&og.body_len);
      }
      ogg_sync_clear(&data);
      _head_local._4_4_ = os.granulepos._4_4_;
    }
    else {
      _head_local._4_4_ = -0x81;
    }
  }
  else {
    _head_local._4_4_ = -0x84;
  }
  return _head_local._4_4_;
}

Assistant:

int op_test(OpusHead *_head,
 const unsigned char *_initial_data,size_t _initial_bytes){
  ogg_sync_state  oy;
  char           *data;
  int             err;
  /*The first page of a normal Opus file will be at most 57 bytes (27 Ogg
     page header bytes + 1 lacing value + 21 Opus header bytes + 8 channel
     mapping bytes).
    It will be at least 47 bytes (27 Ogg page header bytes + 1 lacing value +
     19 Opus header bytes using channel mapping family 0).
    If we don't have at least that much data, give up now.*/
  if(_initial_bytes<47)return OP_FALSE;
  /*Only proceed if we start with the magic OggS string.
    This is to prevent us spending a lot of time allocating memory and looking
     for Ogg pages in non-Ogg files.*/
  if(memcmp(_initial_data,"OggS",4)!=0)return OP_ENOTFORMAT;
  if(OP_UNLIKELY(_initial_bytes>(size_t)LONG_MAX))return OP_EFAULT;
  ogg_sync_init(&oy);
  data=ogg_sync_buffer(&oy,(long)_initial_bytes);
  if(data!=NULL){
    ogg_stream_state os;
    ogg_page         og;
    int              ret;
    memcpy(data,_initial_data,_initial_bytes);
    ogg_sync_wrote(&oy,(long)_initial_bytes);
    ogg_stream_init(&os,-1);
    err=OP_FALSE;
    do{
      ogg_packet op;
      ret=ogg_sync_pageout(&oy,&og);
      /*Ignore holes.*/
      if(ret<0)continue;
      /*Stop if we run out of data.*/
      if(!ret)break;
      ogg_stream_reset_serialno(&os,ogg_page_serialno(&og));
      ogg_stream_pagein(&os,&og);
      /*Only process the first packet on this page (if it's a BOS packet,
         it's required to be the only one).*/
      if(ogg_stream_packetout(&os,&op)==1){
        if(op.b_o_s){
          ret=opus_head_parse(_head,op.packet,op.bytes);
          /*If this didn't look like Opus, keep going.*/
          if(ret==OP_ENOTFORMAT)continue;
          /*Otherwise we're done, one way or another.*/
          err=ret;
        }
        /*We finished parsing the headers.
          There is no Opus to be found.*/
        else err=OP_ENOTFORMAT;
      }
    }
    while(err==OP_FALSE);
    ogg_stream_clear(&os);
  }
  else err=OP_EFAULT;
  ogg_sync_clear(&oy);
  return err;
}